

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O1

Option<Kernel::PolyNf> * __thiscall
Inferences::PolynomialEvaluation::evaluate
          (Option<Kernel::PolyNf> *__return_storage_ptr__,PolynomialEvaluation *this,
          PolyNf *normalized)

{
  RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  *pRVar1;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *pRVar2;
  BottomUpChildIter<Kernel::PolyNf> *pBVar3;
  PolyNf *pPVar4;
  PolyNf *pPVar5;
  ulong uVar6;
  _Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false> _Var7;
  Self SVar8;
  Self SVar9;
  OptionBase<Kernel::PolyNf> *pOVar10;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  RVar11;
  MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf> *this_00;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>
  RVar12;
  bool bVar13;
  uint uVar14;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict6
  RVar15;
  int iVar16;
  uint uVar17;
  BottomUpChildIter<Kernel::PolyNf> *pBVar18;
  long lVar19;
  Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  *this_01;
  BottomUpChildIter<Kernel::PolyNf> **ppBVar20;
  Entry *this_02;
  MaybeUninit<Kernel::PolyNf> *this_03;
  anon_class_16_2_f84bbffd f;
  anon_class_16_2_f84bbffd f_00;
  anon_class_16_2_d708292f f_01;
  anon_class_16_2_d708292f f_02;
  anon_class_16_2_f84bbffd f_03;
  anon_class_16_2_f84bbffd f_04;
  anon_class_16_2_f84bbffd f_05;
  anon_class_16_2_f84bbffd f_06;
  anon_class_16_2_f84bbffd f_07;
  anon_class_16_2_f84bbffd f_08;
  anon_class_16_2_f84bbffd f_09;
  anon_class_16_2_f84bbffd f_10;
  anon_class_16_2_d708292f f_11;
  anon_class_16_2_f84bbffd f_12;
  anon_class_16_2_f84bbffd f_13;
  anon_class_16_2_f84bbffd f_14;
  anon_class_16_2_f84bbffd f_15;
  anon_class_16_2_f84bbffd f_16;
  anon_class_16_2_f84bbffd f_17;
  anon_class_16_2_f84bbffd f_18;
  anon_class_16_2_f84bbffd f_19;
  anon_class_16_2_f84bbffd f_20;
  anon_class_16_2_f84bbffd f_21;
  anon_class_16_2_20c48a23 f_22;
  anon_class_16_2_d708292f f_23;
  anon_class_16_2_20c48a23 f_24;
  anon_class_16_2_d708292f f_25;
  PolyNf res_1;
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  recState;
  PolyNf out;
  PolyNf t;
  Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> recResults;
  Option<Kernel::PolyNf> *outOpt;
  PolyNf eval;
  PolyNf *argLst;
  _Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
  local_288;
  _Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
  _Stack_280;
  _Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_false>
  local_278;
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_268;
  undefined1 local_258 [8];
  char cStack_250;
  char acStack_24f [15];
  undefined5 uStack_240;
  uint uStack_23b;
  undefined3 uStack_237;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_228;
  Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_208;
  OptionBase<Kernel::PolyNf> *local_1f8;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *local_1f0;
  PolyNf local_1e8;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  local_1c8;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  local_1a8;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  local_188;
  ulong local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  PolyNf *local_148;
  anon_class_24_3_9e03d13b local_140;
  ulong local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  ulong local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  anon_class_24_3_9e03d13b local_e8;
  BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
  local_d0;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_b8;
  undefined1 local_a0 [16];
  _Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_false>
  local_90;
  ulong local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict22
  local_58;
  
  local_1f8 = &__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>;
  local_1f0 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               *)normalized;
  if ((evaluate(Kernel::PolyNf)::memo == '\0') &&
     (iVar16 = __cxa_guard_acquire(&evaluate(Kernel::PolyNf)::memo), iVar16 != 0)) {
    evaluate::memo._memo._capacity = 0;
    evaluate::memo._memo._noOfEntries = 0;
    evaluate::memo._memo._entries = (Entry *)0x0;
    ::Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::expand(&evaluate::memo._memo);
    __cxa_atexit(MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>::~MemoNonVars,&evaluate::memo,
                 &__dso_handle);
    __cxa_guard_release(&evaluate(Kernel::PolyNf)::memo);
  }
  local_d0._memo = &evaluate::memo;
  ::Lib::
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_268);
  ::Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_208);
  SVar8._M_t.
  super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
  .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>._M_head_impl
       = (__uniq_ptr_data<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>,_true,_true>
            )local_268._self;
  uStack_70 = 0;
  local_68 = 0;
  local_78 = (ulong)*(byte *)&(((PolyNfSuper *)
                               &local_1f0->
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                               )->_inner).
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                              .
                              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             & 0xffffffffffffff03;
  f.other = local_1f0;
  f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
            *)&local_78;
  ::Lib::CoproductImpl::
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
            ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)&local_78,f);
  local_a0._0_8_ = &local_228;
  f_22.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               *)&local_78;
  f_22.fs_ = (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              *)local_a0;
  local_a0._8_8_ = (anon_class_1_0_00000001 *)&local_288;
  local_90._M_head_impl = (anon_class_1_0_00000001 *)local_258;
  ::Lib::CoproductImpl::
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  switchN<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>::match<Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_>(Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_)&::_lambda(auto:1)_1_>
            (&local_58,
             (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)&local_78,f_22);
  if (*(BottomUpChildIter<Kernel::PolyNf> **)
       ((long)SVar8._M_t.
              super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
              _M_head_impl + 0x10) ==
      *(BottomUpChildIter<Kernel::PolyNf> **)
       ((long)SVar8._M_t.
              super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
              _M_head_impl + 0x18)) {
    ::Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::expand
              ((Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)
               SVar8._M_t.
               super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
               _M_head_impl);
  }
  pRVar1 = *(RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
             **)((long)SVar8._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                       ._M_head_impl + 0x10);
  *(undefined8 *)(pRVar1 + 0x10) = 0;
  *(undefined8 *)(pRVar1 + 0x18) = 0;
  *(undefined8 *)pRVar1 = 0;
  *(undefined8 *)(pRVar1 + 8) = 0;
  *(undefined4 *)(pRVar1 + 0x20) = 0;
  *pRVar1 = (RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
             )(local_58._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
               .
               super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               ._0_1_ & 3);
  f_00.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                *)&local_58;
  f_00.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
               *)pRVar1;
  ::Lib::CoproductImpl::
  RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>>&&)::_lambda(auto:1)_1_>
            (pRVar1,f_00);
  *(BottomUpChildIter<Kernel::PolyNf> **)
   ((long)SVar8._M_t.
          super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
          .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
          _M_head_impl + 0x10) =
       *(BottomUpChildIter<Kernel::PolyNf> **)
        ((long)SVar8._M_t.
               super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
               _M_head_impl + 0x10) + 1;
  pBVar18 = *(BottomUpChildIter<Kernel::PolyNf> **)
             ((long)local_268._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                    ._M_head_impl + 0x10);
  if (pBVar18 !=
      *(BottomUpChildIter<Kernel::PolyNf> **)
       ((long)local_268._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
              _M_head_impl + 8)) {
    do {
      f_01.this = &pBVar18[-1]._self;
      f_01.f = (anon_class_1_0_00000001 *)local_258;
      RVar12 = ::Lib::CoproductImpl::
               RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               ::
               switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                         ((RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                           *)&pBVar18[-1]._self,f_01);
      if (RVar12) {
        this_01 = &(*(BottomUpChildIter<Kernel::PolyNf> **)
                     ((long)local_268._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                            ._M_head_impl + 0x10))[-1]._self;
        f_02.this = this_01;
        f_02.f = (anon_class_1_0_00000001 *)local_258;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ::
        switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                  ((RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    *)this_01,f_02);
        f_23.this = this_01;
        f_23.f = (anon_class_1_0_00000001 *)local_258;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ::
        switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                  ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict21
                    *)&local_228,
                   (RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    *)this_01,f_23);
        uStack_100 = 0;
        local_f8 = 0;
        local_108 = local_228.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._0_8_ & 3;
        f_03.other = &local_228;
        f_03.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)&local_108;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                    *)&local_108,f_03);
        MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>::get
                  ((Option<Kernel::PolyNf> *)local_258,local_d0._memo,(PolyNf *)&local_228);
        SVar9._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl =
             local_208._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl;
        SVar8._M_t.
        super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
        .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
        _M_head_impl = (__uniq_ptr_data<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>,_true,_true>
                        )(__uniq_ptr_data<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>,_true,_true>
                          )local_268._self;
        if (local_258[0] ==
            (RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
             )0x1) {
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[7] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[8] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[9] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[10] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xb] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xc] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xd] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xe] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xf] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x10] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x11] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x12] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x13] = '\0';
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._21_3_ = 0;
          local_188.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._0_8_ = (ulong)local_258 >> 0x20 & 3;
          f_04.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        *)(local_258 + 4);
          f_04.this = &local_188;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_188,f_04);
          if (*(PolyNf **)
               ((long)SVar9._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl +
               0x10) == *(PolyNf **)
                         ((long)SVar9._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>.
                                _M_head_impl + 0x18)) {
            ::Lib::Stack<Kernel::PolyNf>::expand
                      ((Stack<Kernel::PolyNf> *)
                       SVar9._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl);
          }
          ppBVar20 = (BottomUpChildIter<Kernel::PolyNf> **)
                     ((long)SVar9._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                     + 0x10);
          pRVar2 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                    *)*ppBVar20;
          *(undefined8 *)pRVar2 = 0;
          *(undefined8 *)(pRVar2 + 8) = 0;
          *(undefined8 *)(pRVar2 + 0x10) = 0;
          *pRVar2 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                     )(local_188.
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._0_1_ & 3);
          lVar19 = 0x18;
          f_05.other = &local_188;
          f_05.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       *)pRVar2;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                    (pRVar2,f_05);
        }
        else {
          uStack_120 = 0;
          local_118 = 0;
          local_128 = local_228.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._0_8_ & 3;
          f_07.other = &local_228;
          f_07.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)&local_128;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_128,f_07);
          local_288._M_head_impl = (anon_class_1_0_00000001 *)&local_1c8;
          local_278._M_head_impl = (anon_class_1_0_00000001 *)&local_e8;
          f_24.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       *)&local_128;
          f_24.fs_ = (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
                      *)&local_288;
          _Stack_280._M_head_impl = (anon_class_1_0_00000001 *)&local_168;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>::match<Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_>(Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_)&::_lambda(auto:1)_1_>
                    ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict22
                      *)local_a0,
                     (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_128,f_24);
          if (*(BottomUpChildIter<Kernel::PolyNf> **)
               ((long)SVar8._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                      ._M_head_impl + 0x10) ==
              *(BottomUpChildIter<Kernel::PolyNf> **)
               ((long)SVar8._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                      ._M_head_impl + 0x18)) {
            ::Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::expand
                      ((Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)
                       SVar8._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                       ._M_head_impl);
          }
          ppBVar20 = (BottomUpChildIter<Kernel::PolyNf> **)
                     ((long)SVar8._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                            ._M_head_impl + 0x10);
          pRVar1 = (RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    *)*ppBVar20;
          *(undefined8 *)(pRVar1 + 0x10) = 0;
          *(undefined8 *)(pRVar1 + 0x18) = 0;
          *(undefined8 *)pRVar1 = 0;
          *(undefined8 *)(pRVar1 + 8) = 0;
          *(undefined4 *)(pRVar1 + 0x20) = 0;
          *pRVar1 = (RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     )(local_a0[0] & 3);
          lVar19 = 0x24;
          f_08.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                        *)local_a0;
          f_08.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                       *)pRVar1;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>>&&)::_lambda(auto:1)_1_>
                    (pRVar1,f_08);
        }
        *ppBVar20 = (BottomUpChildIter<Kernel::PolyNf> *)
                    (((*ppBVar20)->_self)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                     .
                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     ._content + lVar19 + -1);
      }
      else {
        pBVar3 = *(BottomUpChildIter<Kernel::PolyNf> **)
                  ((long)local_268._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                         ._M_head_impl + 0x10);
        pBVar18 = pBVar3 + -1;
        *(BottomUpChildIter<Kernel::PolyNf> **)
         ((long)local_268._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                ._M_head_impl + 0x10) = pBVar18;
        acStack_24f[7] = '\0';
        acStack_24f[8] = '\0';
        acStack_24f[9] = '\0';
        acStack_24f[10] = '\0';
        acStack_24f[0xb] = '\0';
        acStack_24f[0xc] = 0;
        acStack_24f[0xd] = 0;
        acStack_24f[0xe] = 0;
        uStack_240 = 0;
        cStack_250 = '\0';
        acStack_24f[0] = '\0';
        acStack_24f[1] = '\0';
        acStack_24f[2] = '\0';
        acStack_24f[3] = '\0';
        acStack_24f[4] = '\0';
        acStack_24f[5] = '\0';
        acStack_24f[6] = '\0';
        uStack_23b = 0;
        uStack_237 = 0;
        local_258 = (undefined1  [8])
                    ((ulong)*(byte *)&pBVar3[-1]._self._inner.
                                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                                      .
                                      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    & 0xffffffffffffff03);
        f_06.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                      *)pBVar18;
        f_06.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                     *)local_258;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>>&&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    *)local_258,f_06);
        if (((byte)local_258[0] & 3) == 1) {
          uVar14 = 0;
        }
        else {
          uVar14 = uStack_23b;
          if (((ulong)local_258 & 3) == 0) {
            uVar14 = Kernel::FuncTerm::numTermArguments
                               ((FuncTerm *)CONCAT17(acStack_24f[7],acStack_24f._0_7_));
          }
        }
        SVar9._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
                )local_208._self;
        if (uVar14 == 0) {
          local_148 = (PolyNf *)0x0;
        }
        else {
          pPVar4 = *(PolyNf **)
                    ((long)local_208._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                    + 0x10);
          pPVar5 = *(PolyNf **)
                    ((long)local_208._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                    + 8);
          if (((byte)local_258[0] & 3) == 1) {
            uVar14 = 0;
          }
          else {
            uVar14 = uStack_23b;
            if (((ulong)local_258 & 3) == 0) {
              uVar14 = Kernel::FuncTerm::numTermArguments
                                 ((FuncTerm *)CONCAT17(acStack_24f[7],acStack_24f._0_7_));
            }
          }
          local_148 = *(PolyNf **)
                       ((long)SVar9._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>.
                              _M_head_impl + 8) +
                      (((long)pPVar4 - (long)pPVar5 >> 3) * -0x5555555555555555 - (ulong)uVar14);
        }
        this_00 = local_d0._memo;
        f_25.this = (Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     *)local_258;
        f_25.f = (anon_class_1_0_00000001 *)&local_288;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ::
        switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                  ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict21
                    *)&local_b8,
                   (RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    *)local_258,f_25);
        local_140.this = &local_d0;
        local_140.argLst = &local_148;
        local_140.orig = (BottomUpChildIter<Kernel::PolyNf> *)local_258;
        if ((local_b8.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._0_1_ & 3) == 1) {
          ::Lib::
          BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PolynomialEvaluation.cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
          ::apply::anon_class_24_3_9e03d13b::operator()(&local_1e8,&local_140);
        }
        else {
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[7] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[8] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[9] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[10] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xb] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xc] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xd] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xe] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xf] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x10] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x11] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x12] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x13] = '\0';
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._21_3_ = 0;
          local_1c8.
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._0_8_ = (ulong)(byte)local_b8.
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                .
                                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                ._0_1_ & 0xffffffffffffff03;
          f_09.other = &local_b8;
          f_09.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)&local_1c8;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_1c8,f_09);
          local_e8.argLst = local_140.argLst;
          local_e8.this = local_140.this;
          local_e8.orig = local_140.orig;
          uStack_160 = 0;
          local_158 = 0;
          local_168 = local_1c8.
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._0_8_ & 3;
          f_10.other = &local_1c8;
          f_10.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       *)&local_168;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_168,f_10);
          if (*(int *)((long)this_00 + 0x18) <= *(int *)((long)this_00 + 4)) {
            ::Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::expand(&this_00->_memo);
          }
          RVar11 = local_168._0_1_;
          f_11.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       *)&local_168;
          f_11.f = (anon_class_1_0_00000001 *)&local_288;
          RVar15 = ::Lib::CoproductImpl::
                   RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ::
                   switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                             ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                               *)&local_168,f_11);
          uVar17 = RVar15 + ((byte)RVar11 & 3) * 0x40 + 0x9e3779b9 ^ (byte)RVar11 & 3;
          uVar17 = uVar17 + (uVar17 == 0);
          uVar6 = (ulong)uVar17 % (ulong)*(uint *)&this_00->_memo;
          this_02 = *(Entry **)((long)this_00 + 8) + uVar6;
          uVar14 = (*(Entry **)((long)this_00 + 8))[uVar6].code;
          while (uVar14 != 0) {
            if ((uVar14 == uVar17) &&
               (bVar13 = Kernel::operator==((PolyNf *)&(this_02->_key).__align,(PolyNf *)&local_168)
               , bVar13)) {
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[7] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[8] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[9] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[10] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0xb] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0xc] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0xd] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0xe] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0xf] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0x10] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0x11] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0x12] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0x13] = '\0';
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._21_3_ = 0;
              this_03 = &this_02->_value;
              local_228.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._0_8_ = (ulong)(this_02->_value).__data[0] & 0xffffffffffffff03;
              f_17.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                            *)this_03;
              f_17.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           *)&local_228;
              ::Lib::CoproductImpl::
              RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                        ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                          *)&local_228,f_17);
              _Stack_280._M_head_impl = (anon_class_1_0_00000001 *)0x0;
              local_278._M_head_impl = (anon_class_1_0_00000001 *)0x0;
              local_288._M_head_impl =
                   (anon_class_1_0_00000001 *)
                   (local_228.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._0_8_ & 3);
              f_18.other = &local_228.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              ;
              f_18.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           *)&local_288;
              ::Lib::CoproductImpl::
              RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                        ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                          *)&local_288,f_18);
              if (this_03 != (MaybeUninit<Kernel::PolyNf> *)&local_288) {
                *(undefined8 *)this_03 = 0;
                *(undefined8 *)((long)&this_02->_value + 8) = 0;
                *(undefined8 *)((long)&this_02->_value + 0x10) = 0;
                this_03->__data[0] = (byte)local_288._M_head_impl._0_1_ & 3;
                f_19.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                              *)&local_288;
                f_19.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             *)this_03;
                ::Lib::CoproductImpl::
                RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                ::
                switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                          ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                            *)&this_03->__align,f_19);
              }
              goto LAB_00507b39;
            }
            this_02 = this_02 + 1;
            if (this_02 == *(Entry **)((long)this_00 + 0x10)) {
              this_02 = *(Entry **)((long)this_00 + 8);
            }
            uVar14 = this_02->code;
          }
          *(int *)((long)this_00 + 4) = *(int *)((long)this_00 + 4) + 1;
          _Stack_280._M_head_impl = (anon_class_1_0_00000001 *)0x0;
          local_278._M_head_impl = (anon_class_1_0_00000001 *)0x0;
          local_288._M_head_impl = (anon_class_1_0_00000001 *)(local_168 & 3);
          f_12.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        *)&local_168;
          f_12.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       *)&local_288;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_288,f_12);
          ::Lib::
          BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PolynomialEvaluation.cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
          ::apply::anon_class_24_3_9e03d13b::operator()((PolyNf *)&local_228,&local_e8);
          ::Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::Entry::init
                    (this_02,(EVP_PKEY_CTX *)&local_288);
LAB_00507b39:
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[7] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[8] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[9] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[10] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xb] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xc] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xd] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xe] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xf] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x10] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x11] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x12] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x13] = '\0';
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._21_3_ = 0;
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._0_8_ = (ulong)(this_02->_value).__data[0] & 0xffffffffffffff03;
          f_13.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                        *)&this_02->_value;
          f_13.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)&local_1e8;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_1e8,f_13);
        }
        SVar9._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
                )local_208._self;
        _Var7._M_head_impl = (Stack<Kernel::PolyNf> *)local_208._self;
        if (((byte)local_258[0] & 3) == 1) {
          uVar14 = 0;
        }
        else {
          uVar14 = uStack_23b;
          if (((ulong)local_258 & 3) == 0) {
            uVar14 = Kernel::FuncTerm::numTermArguments
                               ((FuncTerm *)CONCAT17(acStack_24f[7],acStack_24f._0_7_));
            _Var7._M_head_impl =
                 (Stack<Kernel::PolyNf> *)
                 local_208._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl;
          }
        }
        for (; local_208._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl =
                    (__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
                     )(__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
                       )_Var7._M_head_impl, uVar14 != 0; uVar14 = uVar14 - 1) {
          pPVar5 = *(PolyNf **)
                    ((long)SVar9._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                    + 0x10);
          pPVar4 = pPVar5 + -1;
          *(PolyNf **)
           ((long)SVar9._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl + 0x10) =
               pPVar4;
          _Stack_280._M_head_impl = (anon_class_1_0_00000001 *)0x0;
          local_278._M_head_impl = (anon_class_1_0_00000001 *)0x0;
          local_288._M_head_impl =
               (anon_class_1_0_00000001 *)
               ((ulong)*(byte *)&pPVar5[-1].super_PolyNfSuper._inner.
                                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                 .
                                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               & 0xffffffffffffff03);
          f_14.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        *)pPVar4;
          f_14.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       *)&local_288;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_288,f_14);
          _Var7._M_head_impl = (Stack<Kernel::PolyNf> *)local_208._self;
        }
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[7] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[8] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[9] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[10] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xb] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xc] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xd] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xe] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xf] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x10] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x11] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x12] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x13] = '\0';
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._21_3_ = 0;
        local_1a8.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._0_8_ = local_1e8.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._0_8_ & 3;
        f_15.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      *)&local_1e8;
        f_15.this = &local_1a8;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                    *)&local_1a8,f_15);
        if ((_Var7._M_head_impl)->_cursor == (_Var7._M_head_impl)->_end) {
          ::Lib::Stack<Kernel::PolyNf>::expand(_Var7._M_head_impl);
        }
        pRVar2 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                  *)(_Var7._M_head_impl)->_cursor;
        *(undefined8 *)pRVar2 = 0;
        *(undefined8 *)(pRVar2 + 8) = 0;
        *(undefined8 *)(pRVar2 + 0x10) = 0;
        *pRVar2 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                   )(local_1a8.
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._0_1_ & 3);
        f_16.other = &local_1a8;
        f_16.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     *)pRVar2;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                  (pRVar2,f_16);
        (_Var7._M_head_impl)->_cursor = (_Var7._M_head_impl)->_cursor + 1;
      }
      pBVar18 = *(BottomUpChildIter<Kernel::PolyNf> **)
                 ((long)local_268._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                        ._M_head_impl + 0x10);
    } while (pBVar18 !=
             *(BottomUpChildIter<Kernel::PolyNf> **)
              ((long)local_268._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                     ._M_head_impl + 8));
  }
  pPVar5 = *(PolyNf **)
            ((long)local_208._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl + 0x10);
  pPVar4 = pPVar5 + -1;
  *(PolyNf **)
   ((long)local_208._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl + 0x10) = pPVar4;
  cStack_250 = '\0';
  acStack_24f[0] = '\0';
  acStack_24f[1] = '\0';
  acStack_24f[2] = '\0';
  acStack_24f[3] = '\0';
  acStack_24f[4] = '\0';
  acStack_24f[5] = '\0';
  acStack_24f[6] = '\0';
  acStack_24f[7] = '\0';
  acStack_24f[8] = '\0';
  acStack_24f[9] = '\0';
  acStack_24f[10] = '\0';
  acStack_24f[0xb] = '\0';
  acStack_24f[0xc] = 0;
  acStack_24f[0xd] = 0;
  acStack_24f[0xe] = 0;
  local_258 = (undefined1  [8])
              ((ulong)*(byte *)&pPVar5[-1].super_PolyNfSuper._inner.
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                .
                                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              & 0xffffffffffffff03);
  f_20.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                *)pPVar4;
  f_20.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               *)local_258;
  ::Lib::CoproductImpl::
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
            ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)local_258,f_20);
  ::Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_208);
  ::Lib::
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_268);
  bVar13 = Kernel::operator!=((PolyNf *)local_258,(PolyNf *)local_1f0);
  if (bVar13) {
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[7] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[8] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[9] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[10] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xb] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xc] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xd] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xe] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xf] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x10] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x11] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x12] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x13] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x14] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x15] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x16] = '\0';
    local_58._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._0_8_ = (ulong)local_258 & 3;
    f_21.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                  *)local_258;
    f_21.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                 *)&local_58;
    ::Lib::CoproductImpl::
    RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                *)&local_58,f_21);
    pOVar10 = local_1f8;
    ::Lib::OptionBase<Kernel::PolyNf>::OptionBase(local_1f8,(PolyNf *)&local_58);
    local_1f8 = pOVar10;
  }
  else {
    *(undefined8 *)((long)&(local_1f8->_elem)._elem + 8) = 0;
    *(undefined8 *)((long)&(local_1f8->_elem)._elem + 0x10) = 0;
    *(undefined8 *)local_1f8 = 0;
    *(undefined8 *)((long)&(local_1f8->_elem)._elem + 4) = 0;
  }
  return (Option<Kernel::PolyNf> *)local_1f8;
}

Assistant:

Option<PolyNf> PolynomialEvaluation::evaluate(PolyNf normalized) const 
{
  static MemoNonVars<PolyNf, PolyNf> memo;
  auto out = BottomUpEvaluation<PolyNf, PolyNf>()
    .function(
        [&](PolyNf orig, PolyNf* ts) -> PolyNf 
        { 
          return orig.match(
              [&](Perfect<FuncTerm> f)
              { 
                return f->function().tryInterpret()
                  .andThen( [&](Theory::Interpretation && i)  -> Option<PolyNf>
                    { return trySimplify(i, ts); })
                  .unwrapOrElse([&]() -> PolyNf
                    { return PolyNf(perfect(FuncTerm(f->function(), ts))); });

              }, 

              [&](Variable v) 
              { return PolyNf(v); },

              [&](AnyPoly p) 
              { return PolyNf(simplifyPoly(p, ts, /*removeZeros=*/true)); }
          );
        })
    .memo<decltype(memo)&>(memo)
    .apply(normalized);
  auto outOpt = someIf(out != normalized, [&]() { return out; });
  DEBUG("evaluated ", normalized, " ==> ", outOpt)
  return outOpt;
}